

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntUnionFind.cpp
# Opt level: O3

int __thiscall Lib::IntUnionFind::root(IntUnionFind *this,int c)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  
  if ((root(int)::path == '\0') && (iVar3 = __cxa_guard_acquire(&root(int)::path), iVar3 != 0)) {
    root::path._capacity = 8;
    root::path._stack =
         (int *)FixedSizeAllocator<32UL>::alloc
                          ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    root::path._end = root::path._stack + root::path._capacity;
    root::path._cursor = root::path._stack;
    __cxa_atexit(Stack<int>::~Stack,&root::path,&__dso_handle);
    __cxa_guard_release(&root(int)::path);
  }
  piVar4 = this->_parents;
  lVar6 = (long)c;
  piVar1 = root::path._stack;
  if (piVar4[lVar6] != -1) {
    iVar3 = -1;
    iVar5 = c;
    do {
      if (iVar3 != -1) {
        if (root::path._cursor == root::path._end) {
          Stack<int>::expand(&root::path);
          piVar4 = this->_parents;
        }
        *root::path._cursor = iVar3;
        root::path._cursor = root::path._cursor + 1;
      }
      c = piVar4[lVar6];
      lVar6 = (long)c;
      iVar3 = iVar5;
      iVar5 = c;
      piVar1 = root::path._stack;
    } while (piVar4[lVar6] != -1);
  }
  for (; piVar2 = root::path._stack, root::path._cursor != root::path._stack;
      root::path._cursor = root::path._cursor + -1) {
    root::path._stack = piVar1;
    piVar4[root::path._cursor[-1]] = c;
    piVar1 = root::path._stack;
    root::path._stack = piVar2;
  }
  root::path._stack = piVar1;
  return c;
}

Assistant:

int IntUnionFind::root(int c) const
{
  static Stack<int> path(8);
  ASS(path.isEmpty());
  int prev=-1;

  while(_parents[c]!=-1) {
    if(prev!=-1) {
      path.push(prev);
    }
    prev=c;
    c=_parents[c];
  }

  while(path.isNonEmpty()) {
    _parents[path.pop()]=c;
  }
  return c;
}